

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteFor
               (char *values,bool *validity,bitpacking_width_t width,char frame_of_reference,
               idx_t count,void *data_ptr)

{
  long lVar1;
  idx_t iVar2;
  data_ptr_t dst;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,iVar2 + 2);
  WriteMetaData((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,FOR);
  **(char **)((long)data_ptr + 0x40) = frame_of_reference;
  lVar1 = *(long *)((long)data_ptr + 0x40);
  *(long *)((long)data_ptr + 0x40) = lVar1 + 1;
  *(bitpacking_width_t *)(lVar1 + 1) = width;
  dst = (data_ptr_t)(*(long *)((long)data_ptr + 0x40) + 1);
  *(data_ptr_t *)((long)data_ptr + 0x40) = dst;
  BitpackingPrimitives::PackBuffer<signed_char,false>(dst,values,count,width);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<signed_char,_true,_signed_char> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}